

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O3

int corpus_get_phseg(acmod_set_t *acmod_set,s3phseg_t **out_phseg)

{
  int iVar1;
  char *rel_path;
  
  iVar1 = -1;
  if (requires_phseg == '\x01') {
    rel_path = cur_ctl_utt_id;
    if (cur_ctl_utt_id == (char *)0x0) {
      rel_path = cur_ctl_path;
    }
    mk_filename(4,rel_path);
    iVar1 = s3phseg_read(mk_filename::fn,acmod_set,out_phseg);
    iVar1 = iVar1 >> 0x1f;
  }
  return iVar1;
}

Assistant:

int
corpus_get_phseg(acmod_set_t *acmod_set,
		 s3phseg_t **out_phseg)
{
    char *rel_path;

    if (!requires_phseg) {
	/* asked for seg data, but not set up to send it */
	return S3_ERROR;
    }

    /* If control file specifies an utt ID, use it.  O/W use the path */
    if (cur_ctl_utt_id != NULL)
	rel_path = cur_ctl_utt_id;
    else
	rel_path = cur_ctl_path;

    if (s3phseg_read(mk_filename(DATA_TYPE_PHSEG, rel_path),
		     acmod_set,
		     out_phseg) < 0)
	return S3_ERROR;
    
    return S3_SUCCESS;
}